

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntPreInt
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVectorDynamic<> *pCVar8;
  double *pdVar9;
  void *pvVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long in_RCX;
  Index outer;
  long lVar13;
  double *pdVar14;
  char *__function;
  long extraout_RDX;
  long lVar15;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
  *lhs;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebardot;
  Matrix3xN ebar;
  MatrixNxN PI1_matrix;
  MatrixNxN K1_matrix;
  undefined4 auStack_700 [6];
  ChVectorDynamic<> *local_6e8;
  Matrix<double,__1,__1,_0,__1,__1> *local_6e0;
  Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_> local_6d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
  *local_6d0 [2];
  Matrix<double,_8,_3,_1,_8,_3> local_6c0;
  Matrix3xN local_600;
  Matrix3xN local_540;
  Matrix<double,_8,_8,_1,_8,_8> local_480;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_6e8 = Fi;
  CalcCoordMatrix(this,&local_540);
  CalcCoordDerivMatrix(this,&local_600);
  lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
         *)local_280;
  local_280._16_8_ = 0.5;
  local_280._24_8_ = &local_540;
  local_280._40_8_ = &local_540;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,8,3,0,8,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>const>,Eigen::Matrix<double,3,8,1,3,8>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,8,8,1,8,8>>(&local_480,lhs,&local_540);
  if (this->m_damping_enabled == true) {
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[2]
         = this->m_Alpha;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[3]
         = (double)&local_600;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[5]
         = (double)&local_540;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,8,3,0,8,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>const>,Eigen::Matrix<double,3,8,1,3,8>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,8,8,0,8,8>>
              ((Matrix<double,_8,_8,_0,_8,_8> *)local_280,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
                *)&local_6c0,&local_540);
    auVar16 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array + in_RCX));
    auVar17._16_8_ = local_280._16_8_;
    auVar17._0_16_ = local_280._0_16_;
    auVar17._24_8_ = local_280._24_8_;
    auVar17._32_8_ = local_280._32_8_;
    auVar17._40_8_ = local_280._40_8_;
    auVar17._48_16_ = local_280._48_16_;
    auVar17 = vaddpd_avx512f(auVar16,auVar17);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a4280),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array + in_RCX + 8));
    auVar17 = vaddpd_avx512f(auVar17,local_240);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a42a0),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array +
                                  (long)(((Matrix<double,_8,_8,_0,_8,_8> *)local_280)->
                                        super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>
                                        ).m_storage.m_data.array));
    auVar17 = vaddpd_avx512f(auVar17,local_200);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a42c0),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(local_480.
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.
                                 m_storage.m_data.array[0]._0_4_);
    auVar17 = vaddpd_avx512f(auVar17,local_1c0);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a42e0),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array +
                                  (long)(((Matrix<double,_8,_8,_0,_8,_8> *)local_280)->
                                        super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>
                                        ).m_storage.m_data.array));
    auVar17 = vaddpd_avx512f(auVar17,local_180);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a4300),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(local_480.
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.
                                 m_storage.m_data.array[0]._0_4_);
    auVar17 = vaddpd_avx512f(auVar17,local_140);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a4320),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array +
                                  (long)(((Matrix<double,_8,_8,_0,_8,_8> *)local_280)->
                                        super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>
                                        ).m_storage.m_data.array));
    auVar17 = vaddpd_avx512f(auVar17,local_100);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a4340),0xffff,auVar17);
    auVar17 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)local_480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>
                                         .m_storage.m_data.array + extraout_RDX));
    auVar17 = vaddpd_avx512f(auVar17,local_c0);
    vscatterdpd_avx512f(ZEXT864(&local_480) + ZEXT864(0) + ZEXT3264(_DAT_009a4360),0xffff,auVar17);
  }
  local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0] =
       (double)&this->m_O1;
  local_6d0[0] = lhs;
  local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[1] =
       (double)&local_480;
  if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x40) {
    Eigen::internal::
    Assignment<Eigen::Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_> *)local_6d0,
          (SrcXprType *)&local_6c0,(assign_op<double,_double> *)&local_6e0);
    if (((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 8) ||
       ((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 8)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 8, 8, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 8, 8, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    pdVar14 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    this_00 = &this->m_K13Compact;
    if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 8) ||
       ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 8)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x40,8,8);
      if (((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows != 8) ||
         ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols != 8)) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 8, 8, 1>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar13 = 0;
    do {
      lVar15 = 0;
      do {
        *(double *)((long)pdVar9 + lVar15) =
             *(double *)(&lhs->field_0x0 + lVar15 * 8) - *(double *)((long)pdVar14 + lVar15);
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x40);
      lVar13 = lVar13 + 1;
      pdVar14 = pdVar14 + 8;
      lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
             *)&lhs->m_lhs;
      pdVar9 = pdVar9 + 8;
    } while (lVar13 != 8);
    if ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols == 8) {
      local_6e0 = this_00;
      local_6d8.m_matrix = &local_540;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::evalTo<Eigen::Matrix<double,8,3,1,8,3>>(&local_6c0,this_00,&local_6d8);
      pCVar8 = local_6e8;
      pdVar14 = (local_6e8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      if ((local_6e8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != 0x18) {
        if (pdVar14 != (double *)0x0) {
          free((void *)pdVar14[-1]);
        }
        pvVar10 = malloc(0x100);
        if (pvVar10 == (void *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ostream::_M_insert<bool>;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        *(void **)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x38) = pvVar10;
        pdVar14 = (double *)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x40);
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar14;
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
             0x18;
      }
      uVar11 = 0xfffffffffffffff8;
      do {
        dVar1 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 9];
        dVar2 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 10];
        dVar3 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 0xb];
        dVar4 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 0xc];
        dVar5 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 0xd];
        dVar6 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 0xe];
        dVar7 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar11 + 0xf];
        pdVar9 = pdVar14 + uVar11 + 8;
        *pdVar9 = local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                  m_data.array[uVar11 + 8];
        pdVar9[1] = dVar1;
        pdVar9[2] = dVar2;
        pdVar9[3] = dVar3;
        pdVar9[4] = dVar4;
        pdVar9[5] = dVar5;
        pdVar9[6] = dVar6;
        pdVar9[7] = dVar7;
        uVar11 = uVar11 + 8;
      } while (uVar11 < 0x10);
      return;
    }
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 8, 1>>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Map<Eigen::Matrix<double, 64, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<double, 64, 1>>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}